

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityStatePdu.cpp
# Opt level: O1

void __thiscall DIS::EntityStatePdu::marshal(EntityStatePdu *this,DataStream *dataStream)

{
  undefined8 *puVar1;
  pointer pAVar2;
  ulong uVar3;
  long lVar4;
  ArticulationParameter x;
  ArticulationParameter local_48;
  
  EntityInformationFamilyPdu::marshal(&this->super_EntityInformationFamilyPdu,dataStream);
  EntityID::marshal(&this->_entityID,dataStream);
  DataStream::operator<<(dataStream,this->_forceId);
  DataStream::operator<<
            (dataStream,
             (char)((uint)(*(int *)&(this->_articulationParameters).
                                    super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(this->_articulationParameters).
                                   super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55);
  EntityType::marshal(&this->_entityType,dataStream);
  EntityType::marshal(&this->_alternativeEntityType,dataStream);
  Vector3Float::marshal(&this->_entityLinearVelocity,dataStream);
  Vector3Double::marshal(&this->_entityLocation,dataStream);
  Orientation::marshal(&this->_entityOrientation,dataStream);
  DataStream::operator<<(dataStream,this->_entityAppearance);
  DeadReckoningParameter::marshal(&this->_deadReckoningParameters,dataStream);
  Marking::marshal(&this->_marking,dataStream);
  DataStream::operator<<(dataStream,this->_capabilities);
  pAVar2 = (this->_articulationParameters).
           super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_articulationParameters).
      super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>.
      _M_impl.super__Vector_impl_data._M_finish != pAVar2) {
    lVar4 = 8;
    uVar3 = 0;
    do {
      local_48._vptr_ArticulationParameter = (_func_int **)&PTR__ArticulationParameter_0019f588;
      puVar1 = (undefined8 *)((long)&pAVar2->_vptr_ArticulationParameter + lVar4);
      local_48._8_8_ = *puVar1;
      local_48._parameterValue = (double)puVar1[1];
      ArticulationParameter::marshal(&local_48,dataStream);
      ArticulationParameter::~ArticulationParameter(&local_48);
      uVar3 = uVar3 + 1;
      pAVar2 = (this->_articulationParameters).
               super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x18;
    } while (uVar3 < (ulong)(((long)(this->_articulationParameters).
                                    super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2 >> 3)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void EntityStatePdu::marshal(DataStream& dataStream) const
{
    EntityInformationFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _entityID.marshal(dataStream);
    dataStream << _forceId;
    dataStream << ( char )_articulationParameters.size();
    _entityType.marshal(dataStream);
    _alternativeEntityType.marshal(dataStream);
    _entityLinearVelocity.marshal(dataStream);
    _entityLocation.marshal(dataStream);
    _entityOrientation.marshal(dataStream);
    dataStream << _entityAppearance;
    _deadReckoningParameters.marshal(dataStream);
    _marking.marshal(dataStream);
    dataStream << _capabilities;

     for(size_t idx = 0; idx < _articulationParameters.size(); idx++)
     {
        ArticulationParameter x = _articulationParameters[idx];
        x.marshal(dataStream);
     }

}